

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

Result<std::shared_ptr<const_CTransaction>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::createTransaction
          (Result<std::shared_ptr<const_CTransaction>_> *__return_storage_ptr__,WalletImpl *this,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
          CCoinControl *coin_control,bool sign,int *change_pos,CAmount *fee)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  T *pTVar3;
  _Storage<unsigned_int,_true> _Var4;
  optional<unsigned_int> change_pos_00;
  long in_FS_OFFSET;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_148;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  bilingual_str local_120;
  Result<wallet::CreatedTransactionResult> res;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock17,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x11d,false);
  change_pos_00.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = *change_pos != -1;
  change_pos_00.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = *change_pos;
  change_pos_00.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._5_3_ = 0;
  CreateTransaction(&res,(this->m_wallet).
                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)recipients,
                    change_pos_00,coin_control,sign);
  if (res.m_variant.super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
      '\x01') {
    pTVar3 = util::Result<wallet::CreatedTransactionResult>::value(&res);
    *fee = pTVar3->fee;
    if ((pTVar3->change_pos).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      _Var4._M_value = 0xffffffff;
    }
    else {
      _Var4 = (pTVar3->change_pos).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload;
    }
    *change_pos = (int)_Var4;
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_148,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)pTVar3);
    _Var2._M_pi = local_148._M_refcount._M_pi;
    local_148._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> =
         local_148._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> + 8)
         = _Var2._M_pi;
    local_148._M_ptr = (element_type *)0x0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
     0x40) = '\x01';
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  }
  else {
    util::ErrorString<wallet::CreatedTransactionResult>(&local_120,&res);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::shared_ptr<CTransaction_const>>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::shared_ptr<CTransaction_const>> *)
               __return_storage_ptr__,&local_120);
    bilingual_str::~bilingual_str(&local_120);
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                      &res);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTransactionRef> createTransaction(const std::vector<CRecipient>& recipients,
        const CCoinControl& coin_control,
        bool sign,
        int& change_pos,
        CAmount& fee) override
    {
        LOCK(m_wallet->cs_wallet);
        auto res = CreateTransaction(*m_wallet, recipients, change_pos == -1 ? std::nullopt : std::make_optional(change_pos),
                                     coin_control, sign);
        if (!res) return util::Error{util::ErrorString(res)};
        const auto& txr = *res;
        fee = txr.fee;
        change_pos = txr.change_pos ? int(*txr.change_pos) : -1;

        return txr.tx;
    }